

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int __thiscall CVmConsole::close_command_log(CVmConsole *this)

{
  long lVar1;
  void *pvVar2;
  int in_ESI;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_f8 [2];
  long local_f0;
  void *local_e8;
  __jmp_buf_tag local_e0;
  
  if (this->command_fp_ != (CVmDataSource *)0x0) {
    (*this->command_fp_->_vptr_CVmDataSource[1])();
    G_err_frame::__tls_init();
    local_f0 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_f8;
    local_f8[0] = _setjmp(&local_e0);
    if (local_f8[0] == 0) {
      CVmNetFile::close(this->command_nf_,in_ESI);
    }
    lVar1 = local_f0;
    if (local_f8[0] == 1) {
      local_f8[0] = 2;
    }
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_f8[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_e8;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_f8[0] & 2) != 0) {
      free(local_e8);
    }
    this->command_fp_ = (CVmDataSource *)0x0;
  }
  if (this->command_glob_ != (vm_globalvar_t *)0x0) {
    (this->command_glob_->val).typ = VM_NIL;
  }
  return 0;
}

Assistant:

int CVmConsole::close_command_log(VMG0_)
{
    /* if there's a command log file, close it */
    if (command_fp_ != 0)
    {
        /* close the file */
        delete command_fp_;

        /* close the network file */
        err_try
        {
            command_nf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* 
             *   ignore any errors - our interface doesn't give us any
             *   meaningful way to return error information
             */
        }
        err_end;

        /* forget the file */
        command_fp_ = 0;
    }